

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O2

string * __thiscall
kws::Parser::FindNextWord_abi_cxx11_(string *__return_storage_ptr__,Parser *this,size_t pos)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  ulong uVar4;
  allocator local_21;
  
  do {
    uVar4 = pos;
    if ((this->m_BufferNoComment)._M_dataplus._M_p[uVar4] == ' ') break;
    pos = uVar4 + 1;
  } while (uVar4 < (this->m_BufferNoComment)._M_string_length);
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_21);
  bVar3 = true;
  bVar2 = 0;
  while ((uVar4 < (this->m_BufferNoComment)._M_string_length && (bVar3))) {
    cVar1 = (this->m_BufferNoComment)._M_dataplus._M_p[uVar4];
    if ((cVar1 == '\r') || (cVar1 == ' ')) {
      bVar3 = (bool)(bVar2 ^ 1);
    }
    else {
      bVar3 = true;
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      bVar2 = 1;
    }
    uVar4 = uVar4 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Parser::FindNextWord(size_t pos) const
{
  size_t i=pos;

  // we go to the next space
  while(m_BufferNoComment[i] != ' ' && i<m_BufferNoComment.size())
    {
    i++;
    }

  bool inWord = true;
  bool first = false;
  std::string ivar = "";
  while(i<m_BufferNoComment.size() && inWord)
    {
    if(m_BufferNoComment[i] != ' ' && m_BufferNoComment[i] != '\r')
      {
      ivar += m_BufferNoComment[i];
      inWord = true;
      first = true;
      }
    else // we have a space
      {
      if(first)
        {
        inWord = false;
        }
      }
    i++;
    }
  return ivar;
}